

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ascii_art.c
# Opt level: O1

cf_int_t cfx_art_print(cf_char_t *input,cf_char_t *buff,cf_size_t size,cfx_art_font_t font)

{
  long lVar1;
  cf_size_t cVar2;
  cf_void_t *addr;
  long lVar3;
  long lVar4;
  cf_int_t cVar5;
  char *pcVar6;
  char cVar7;
  cf_char_t *pcVar8;
  ulong uVar9;
  
  cVar5 = -1;
  if (buff != (cf_char_t *)0x0 && input != (cf_char_t *)0x0) {
    cVar2 = cf_strlen(input);
    if (cVar2 == 0) {
      cVar5 = 0;
    }
    else {
      addr = cf_malloc_dbg(cVar2 * 8,1,
                           "/workspace/llm4binary/github/license_all_cmakelists_25/tkorays[P]CFAST/src/cfx/ascii_art.c"
                           ,"cfx_art_print",0xe3);
      cVar7 = *input;
      if (cVar7 != '\0') {
        lVar3 = 0;
        do {
          pcVar8 = art_tab;
          if ((cVar7 != '\t') && (pcVar8 = art_space, cVar7 != ' ')) {
            if (cVar7 < '!') {
LAB_00101454:
              cf_free_dbg(addr,
                          "/workspace/llm4binary/github/license_all_cmakelists_25/tkorays[P]CFAST/src/cfx/ascii_art.c"
                          ,"cfx_art_print",0x112);
              *buff = '\0';
              return -1;
            }
            if (font == CFX_ART_FONT_SLANT) {
              pcVar8 = ascii_map_slant_rel +
                       *(int *)(ascii_map_slant_rel + (ulong)(uint)(int)(char)(cVar7 + -0x21) * 4);
            }
            else {
              pcVar8 = ascii_map_rel +
                       *(int *)(ascii_map_rel + (ulong)(uint)(int)(char)(cVar7 + -0x21) * 4);
            }
          }
          *(cf_char_t **)((long)addr + lVar3 * 8) = pcVar8;
          cVar7 = input[lVar3 + 1];
          lVar3 = lVar3 + 1;
        } while (cVar7 != '\0');
      }
      uVar9 = 0;
      lVar3 = 0;
      do {
        lVar4 = 0;
        do {
          pcVar6 = *(char **)((long)addr + lVar4 * 8);
          cVar7 = *pcVar6;
          while (cVar7 != '\n') {
            if (size < uVar9) goto LAB_00101454;
            buff[uVar9] = cVar7;
            uVar9 = uVar9 + 1;
            lVar1 = *(long *)((long)addr + lVar4 * 8);
            pcVar6 = (char *)(lVar1 + 1);
            *(char **)((long)addr + lVar4 * 8) = pcVar6;
            cVar7 = *(char *)(lVar1 + 1);
          }
          *(char **)((long)addr + lVar4 * 8) = pcVar6 + 1;
          lVar4 = lVar4 + 1;
        } while (lVar4 != cVar2 + (cVar2 == 0));
        buff[uVar9] = '\n';
        uVar9 = uVar9 + 1;
        lVar3 = lVar3 + 1;
      } while (lVar3 != 6);
      cf_free_dbg(addr,
                  "/workspace/llm4binary/github/license_all_cmakelists_25/tkorays[P]CFAST/src/cfx/ascii_art.c"
                  ,"cfx_art_print",0x10d);
      buff[uVar9] = '\0';
      cVar5 = (cf_int_t)uVar9;
    }
  }
  return cVar5;
}

Assistant:

cf_int_t cfx_art_print(const cf_char_t* input, cf_char_t* buff, cf_size_t size, cfx_art_font_t font) {
    const cf_char_t** pp = CF_NULL_PTR;
    cf_size_t i = 0, j = 0, cnt = 0, len;
    if (input == CF_NULL_PTR || buff == CF_NULL_PTR) return -1;

    len = cf_strlen(input);
    if (len == 0) return 0;

    pp = cf_malloc_z(sizeof(cf_char_t*) * len);

    /* initialize the map pointer */
    i = 0;
    while (*input) {
        if (*input == ' ') {
            pp[i] = art_space;
        } else if (*input == '\t') {
            pp[i] = art_tab;
        } else if (*input < CFX_ART_MAP_BEGIN || *input > CFX_ART_MAP_END) {
            goto CFX_ART_FAIL;
        } else {
            switch (font) {
                case CFX_ART_FONT_SLANT:
                    pp[i] = ascii_map_slant[*input - CFX_ART_MAP_BEGIN];
                    break;
                default:
                    pp[i] = ascii_map[*input - CFX_ART_MAP_BEGIN];
                    break;
            }
        }
        input++;
        i++;
    }

    /* for each line */
    i = 0;
    while (i < CFX_ART_MAX_LINES) {
        /* write one by one */
        j = 0;
        while (j < len) {
            while (*pp[j] != '\n') {
                if (cnt > size) goto CFX_ART_FAIL;
                buff[cnt++] = *pp[j];
                pp[j]++;
            }
            pp[j]++;
            j++;
        }
        buff[cnt++] = '\n';
        i++;
    }
    cf_free(pp);
    buff[cnt] = '\0';
    return cnt;

CFX_ART_FAIL:
    cf_free(pp);
    buff[0] = '\0';
    return -1;
}